

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O3

vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_> *
tinyusdz::lerp<tinyusdz::value::texcoord3h>
          (vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
           *__return_storage_ptr__,
          vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_> *a,
          vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_> *b,
          double t)

{
  pointer ptVar1;
  texcoord3h tVar2;
  ulong uVar3;
  long lVar4;
  ulong __new_size;
  texcoord3h local_48;
  texcoord3h local_40 [2];
  float local_34;
  
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = ((long)(a->
                 super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(a->
                 super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 1) * -0x5555555555555555;
  __new_size = ((long)(b->
                      super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(b->
                      super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 1) * -0x5555555555555555;
  if (uVar3 <= __new_size) {
    __new_size = uVar3;
  }
  if (__new_size != 0) {
    std::vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>::resize
              (__return_storage_ptr__,__new_size);
    if ((long)(a->
              super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(a->
              super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
              )._M_impl.super__Vector_impl_data._M_start ==
        (long)(b->
              super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(b->
              super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
              )._M_impl.super__Vector_impl_data._M_start) {
      local_34 = (float)(1.0 - t);
      lVar4 = 0;
      do {
        ptVar1 = (b->
                 super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        tVar2 = operator*(local_34,(texcoord3h *)
                                   ((long)&(((a->
                                             super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                                             )._M_impl.super__Vector_impl_data._M_start)->s).value +
                                   lVar4));
        local_40[0]._0_4_ = tVar2._0_4_;
        local_40[0].r = tVar2.r.value;
        tVar2 = operator*((float)t,(texcoord3h *)((long)&(ptVar1->s).value + lVar4));
        local_48._0_4_ = tVar2._0_4_;
        local_48.r = tVar2.r.value;
        tVar2 = operator+(local_40,&local_48);
        ptVar1 = (__return_storage_ptr__->
                 super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        *(int *)((long)&(ptVar1->s).value + lVar4) = tVar2._0_4_;
        *(uint16_t *)((long)&(ptVar1->r).value + lVar4) = tVar2.r.value.value;
        lVar4 = lVar4 + 6;
        __new_size = __new_size - 1;
      } while (__new_size != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}